

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1.h
# Opt level: O0

void ncnn::conv3x3s1_pack8to1_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [32];
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  long lVar46;
  long lVar47;
  long lVar48;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  float *pfVar49;
  long lVar50;
  long *in_RDI;
  __m128 _sum;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _sum2;
  __m256 _sum1;
  __m256 _sum0;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  int j;
  float *r2;
  float *r1;
  float *r0;
  int i_1;
  __m256 _k22;
  __m256 _k21;
  __m256 _k20;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  Mat img0;
  float *outptr0;
  int q;
  float *k0;
  float bias0;
  Mat out0;
  int p;
  int remain_outch_start;
  float *bias;
  int outch;
  int outh;
  int outw;
  int inch;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  int i;
  float *ptr;
  int size;
  __m256 s0123;
  __m256 s23;
  __m256 s01;
  __m256 v3;
  __m128 x32;
  __m128 x64;
  float local_f2c;
  int local_d64;
  undefined8 *local_d60;
  undefined8 *local_d58;
  undefined8 *local_d50;
  int local_d44;
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d28;
  float fStack_d24;
  float local_d20;
  float fStack_d1c;
  float fStack_d18;
  float fStack_d14;
  float fStack_d10;
  float fStack_d0c;
  float fStack_d08;
  float fStack_d04;
  float local_d00;
  float fStack_cfc;
  float fStack_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float fStack_ce8;
  float fStack_ce4;
  float local_ce0;
  float fStack_cdc;
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_cc4;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  float local_ca0;
  float fStack_c9c;
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  float *local_bc8;
  int local_bbc;
  undefined8 *local_b70;
  int local_b10;
  int local_b08;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  int local_3e4;
  float *local_3e0;
  float local_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  float local_240;
  float fStack_23c;
  
  lVar46 = in_RDI[7];
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar47 = in_RSI[6];
  lVar48 = in_RSI[7];
  lVar4 = *in_RCX;
  for (local_b08 = 0; local_b08 < (int)lVar48; local_b08 = local_b08 + 1) {
    iVar3 = *(int *)((long)in_RSI + 0x34);
    pfVar49 = (float *)(*in_RSI + in_RSI[8] * (long)local_b08 * in_RSI[2]);
    local_b10 = (int)(((long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] * in_RSI[2] + 0xfU
                      & 0xfffffffffffffff0) / (ulong)in_RSI[2]);
    if ((int)in_RSI[5] == 4) {
      local_b10 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6];
    }
    if (lVar4 == 0) {
      local_f2c = 0.0;
    }
    else {
      local_f2c = *(float *)(lVar4 + (long)local_b08 * 4);
    }
    local_3e0 = pfVar49;
    for (local_3e4 = 0; local_3e4 < local_b10 * iVar3; local_3e4 = local_3e4 + 1) {
      *local_3e0 = local_f2c;
      local_3e0 = local_3e0 + 1;
    }
    local_b70 = (undefined8 *)(*in_RDX + in_RDX[8] * (long)local_b08 * in_RDX[2]);
    for (local_bbc = 0; local_bbc < (int)lVar46; local_bbc = local_bbc + 1) {
      iVar3 = *(int *)((long)in_RDI + 0x2c);
      lVar50 = *in_RDI + in_RDI[8] * (long)local_bbc * in_RDI[2];
      lVar5 = in_RDI[2];
      uVar10 = *local_b70;
      uVar11 = local_b70[1];
      uVar12 = local_b70[2];
      uVar13 = local_b70[3];
      uVar14 = local_b70[4];
      uVar15 = local_b70[5];
      uVar16 = local_b70[6];
      uVar17 = local_b70[7];
      uVar18 = local_b70[8];
      uVar19 = local_b70[9];
      uVar20 = local_b70[10];
      uVar21 = local_b70[0xb];
      uVar22 = local_b70[0xc];
      uVar23 = local_b70[0xd];
      uVar24 = local_b70[0xe];
      uVar25 = local_b70[0xf];
      uVar26 = local_b70[0x10];
      uVar27 = local_b70[0x11];
      uVar28 = local_b70[0x12];
      uVar29 = local_b70[0x13];
      uVar30 = local_b70[0x14];
      uVar31 = local_b70[0x15];
      uVar32 = local_b70[0x16];
      uVar33 = local_b70[0x17];
      uVar34 = local_b70[0x18];
      uVar35 = local_b70[0x19];
      uVar36 = local_b70[0x1a];
      uVar37 = local_b70[0x1b];
      uVar38 = local_b70[0x1c];
      uVar39 = local_b70[0x1d];
      uVar40 = local_b70[0x1e];
      uVar41 = local_b70[0x1f];
      auVar1 = *(undefined1 (*) [32])(local_b70 + 0x20);
      local_bc8 = pfVar49;
      for (local_d44 = 0; local_d44 < (int)lVar47; local_d44 = local_d44 + 1) {
        local_d50 = (undefined8 *)(lVar50 + (long)iVar3 * (long)local_d44 * lVar5);
        local_d58 = (undefined8 *)(lVar50 + (long)iVar3 * (long)(local_d44 + 1) * lVar5);
        local_d60 = (undefined8 *)(lVar50 + (long)iVar3 * (long)(local_d44 + 2) * lVar5);
        for (local_d64 = 0; local_d64 < iVar2; local_d64 = local_d64 + 1) {
          local_420 = (float)uVar10;
          fStack_41c = (float)((ulong)uVar10 >> 0x20);
          fStack_418 = (float)uVar11;
          fStack_414 = (float)((ulong)uVar11 >> 0x20);
          fStack_410 = (float)uVar12;
          fStack_40c = (float)((ulong)uVar12 >> 0x20);
          fStack_408 = (float)uVar13;
          fStack_404 = (float)((ulong)uVar13 >> 0x20);
          local_440 = (float)*local_d50;
          fStack_43c = (float)((ulong)*local_d50 >> 0x20);
          fStack_438 = (float)local_d50[1];
          fStack_434 = (float)((ulong)local_d50[1] >> 0x20);
          fStack_430 = (float)local_d50[2];
          fStack_42c = (float)((ulong)local_d50[2] >> 0x20);
          fStack_428 = (float)local_d50[3];
          local_460 = (float)uVar14;
          fStack_45c = (float)((ulong)uVar14 >> 0x20);
          fStack_458 = (float)uVar15;
          fStack_454 = (float)((ulong)uVar15 >> 0x20);
          fStack_450 = (float)uVar16;
          fStack_44c = (float)((ulong)uVar16 >> 0x20);
          fStack_448 = (float)uVar17;
          fStack_444 = (float)((ulong)uVar17 >> 0x20);
          local_480 = (float)local_d50[4];
          fStack_47c = (float)((ulong)local_d50[4] >> 0x20);
          fStack_478 = (float)local_d50[5];
          fStack_474 = (float)((ulong)local_d50[5] >> 0x20);
          fStack_470 = (float)local_d50[6];
          fStack_46c = (float)((ulong)local_d50[6] >> 0x20);
          fStack_468 = (float)local_d50[7];
          local_4a0 = (float)uVar18;
          fStack_49c = (float)((ulong)uVar18 >> 0x20);
          fStack_498 = (float)uVar19;
          fStack_494 = (float)((ulong)uVar19 >> 0x20);
          fStack_490 = (float)uVar20;
          fStack_48c = (float)((ulong)uVar20 >> 0x20);
          fStack_488 = (float)uVar21;
          fStack_484 = (float)((ulong)uVar21 >> 0x20);
          local_4c0 = (float)local_d50[8];
          fStack_4bc = (float)((ulong)local_d50[8] >> 0x20);
          fStack_4b8 = (float)local_d50[9];
          fStack_4b4 = (float)((ulong)local_d50[9] >> 0x20);
          fStack_4b0 = (float)local_d50[10];
          fStack_4ac = (float)((ulong)local_d50[10] >> 0x20);
          fStack_4a8 = (float)local_d50[0xb];
          local_ca0 = (float)uVar22;
          fStack_c9c = (float)((ulong)uVar22 >> 0x20);
          fStack_c98 = (float)uVar23;
          fStack_c94 = (float)((ulong)uVar23 >> 0x20);
          fStack_c90 = (float)uVar24;
          fStack_c8c = (float)((ulong)uVar24 >> 0x20);
          fStack_c88 = (float)uVar25;
          fStack_c84 = (float)((ulong)uVar25 >> 0x20);
          local_640 = (float)*local_d58;
          fStack_63c = (float)((ulong)*local_d58 >> 0x20);
          fStack_638 = (float)local_d58[1];
          fStack_634 = (float)((ulong)local_d58[1] >> 0x20);
          fStack_630 = (float)local_d58[2];
          fStack_62c = (float)((ulong)local_d58[2] >> 0x20);
          fStack_628 = (float)local_d58[3];
          local_cc0 = (float)uVar26;
          fStack_cbc = (float)((ulong)uVar26 >> 0x20);
          fStack_cb8 = (float)uVar27;
          fStack_cb4 = (float)((ulong)uVar27 >> 0x20);
          fStack_cb0 = (float)uVar28;
          fStack_cac = (float)((ulong)uVar28 >> 0x20);
          fStack_ca8 = (float)uVar29;
          fStack_ca4 = (float)((ulong)uVar29 >> 0x20);
          local_600 = (float)local_d58[4];
          fStack_5fc = (float)((ulong)local_d58[4] >> 0x20);
          fStack_5f8 = (float)local_d58[5];
          fStack_5f4 = (float)((ulong)local_d58[5] >> 0x20);
          fStack_5f0 = (float)local_d58[6];
          fStack_5ec = (float)((ulong)local_d58[6] >> 0x20);
          fStack_5e8 = (float)local_d58[7];
          local_ce0 = (float)uVar30;
          fStack_cdc = (float)((ulong)uVar30 >> 0x20);
          fStack_cd8 = (float)uVar31;
          fStack_cd4 = (float)((ulong)uVar31 >> 0x20);
          fStack_cd0 = (float)uVar32;
          fStack_ccc = (float)((ulong)uVar32 >> 0x20);
          fStack_cc8 = (float)uVar33;
          fStack_cc4 = (float)((ulong)uVar33 >> 0x20);
          local_5c0 = (float)local_d58[8];
          fStack_5bc = (float)((ulong)local_d58[8] >> 0x20);
          fStack_5b8 = (float)local_d58[9];
          fStack_5b4 = (float)((ulong)local_d58[9] >> 0x20);
          fStack_5b0 = (float)local_d58[10];
          fStack_5ac = (float)((ulong)local_d58[10] >> 0x20);
          fStack_5a8 = (float)local_d58[0xb];
          local_d00 = (float)uVar34;
          fStack_cfc = (float)((ulong)uVar34 >> 0x20);
          fStack_cf8 = (float)uVar35;
          fStack_cf4 = (float)((ulong)uVar35 >> 0x20);
          fStack_cf0 = (float)uVar36;
          fStack_cec = (float)((ulong)uVar36 >> 0x20);
          fStack_ce8 = (float)uVar37;
          fStack_ce4 = (float)((ulong)uVar37 >> 0x20);
          local_580 = (float)*local_d60;
          fStack_57c = (float)((ulong)*local_d60 >> 0x20);
          fStack_578 = (float)local_d60[1];
          fStack_574 = (float)((ulong)local_d60[1] >> 0x20);
          fStack_570 = (float)local_d60[2];
          fStack_56c = (float)((ulong)local_d60[2] >> 0x20);
          fStack_568 = (float)local_d60[3];
          local_d20 = (float)uVar38;
          fStack_d1c = (float)((ulong)uVar38 >> 0x20);
          fStack_d18 = (float)uVar39;
          fStack_d14 = (float)((ulong)uVar39 >> 0x20);
          fStack_d10 = (float)uVar40;
          fStack_d0c = (float)((ulong)uVar40 >> 0x20);
          fStack_d08 = (float)uVar41;
          fStack_d04 = (float)((ulong)uVar41 >> 0x20);
          local_540 = (float)local_d60[4];
          fStack_53c = (float)((ulong)local_d60[4] >> 0x20);
          fStack_538 = (float)local_d60[5];
          fStack_534 = (float)((ulong)local_d60[5] >> 0x20);
          fStack_530 = (float)local_d60[6];
          fStack_52c = (float)((ulong)local_d60[6] >> 0x20);
          fStack_528 = (float)local_d60[7];
          local_d40 = auVar1._0_4_;
          fStack_d3c = auVar1._4_4_;
          fStack_d38 = auVar1._8_4_;
          fStack_d34 = auVar1._12_4_;
          fStack_d30 = auVar1._16_4_;
          fStack_d2c = auVar1._20_4_;
          fStack_d28 = auVar1._24_4_;
          fStack_d24 = auVar1._28_4_;
          local_500 = (float)local_d60[8];
          fStack_4fc = (float)((ulong)local_d60[8] >> 0x20);
          fStack_4f8 = (float)local_d60[9];
          fStack_4f4 = (float)((ulong)local_d60[9] >> 0x20);
          fStack_4f0 = (float)local_d60[10];
          fStack_4ec = (float)((ulong)local_d60[10] >> 0x20);
          fStack_4e8 = (float)local_d60[0xb];
          auVar8 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(0),0x30);
          auVar9 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(0),0x30);
          uStack_2d0 = auVar9._0_8_;
          uStack_2c8 = auVar9._8_8_;
          auVar45._4_4_ =
               fStack_cfc * fStack_57c + fStack_c9c * fStack_63c + fStack_41c * fStack_43c;
          auVar45._0_4_ = local_d00 * local_580 + local_ca0 * local_640 + local_420 * local_440;
          auVar45._8_4_ =
               fStack_cf8 * fStack_578 + fStack_c98 * fStack_638 + fStack_418 * fStack_438;
          auVar45._12_4_ =
               fStack_cf4 * fStack_574 + fStack_c94 * fStack_634 + fStack_414 * fStack_434;
          auVar45._16_4_ =
               fStack_cf0 * fStack_570 + fStack_c90 * fStack_630 + fStack_410 * fStack_430;
          auVar45._20_4_ =
               fStack_cec * fStack_56c + fStack_c8c * fStack_62c + fStack_40c * fStack_42c;
          auVar45._24_4_ =
               fStack_ce8 * fStack_568 + fStack_c88 * fStack_628 + fStack_408 * fStack_428;
          auVar45._28_4_ = fStack_ce4 + fStack_c84 + fStack_404;
          auVar6._4_4_ = fStack_d1c * fStack_53c + fStack_cbc * fStack_5fc + fStack_45c * fStack_47c
          ;
          auVar6._0_4_ = local_d20 * local_540 + local_cc0 * local_600 + local_460 * local_480;
          auVar6._8_4_ = fStack_d18 * fStack_538 + fStack_cb8 * fStack_5f8 + fStack_458 * fStack_478
          ;
          auVar6._12_4_ =
               fStack_d14 * fStack_534 + fStack_cb4 * fStack_5f4 + fStack_454 * fStack_474;
          auVar6._16_4_ =
               fStack_d10 * fStack_530 + fStack_cb0 * fStack_5f0 + fStack_450 * fStack_470;
          auVar6._20_4_ =
               fStack_d0c * fStack_52c + fStack_cac * fStack_5ec + fStack_44c * fStack_46c;
          auVar6._24_4_ =
               fStack_d08 * fStack_528 + fStack_ca8 * fStack_5e8 + fStack_448 * fStack_468;
          auVar6._28_4_ = fStack_d04 + fStack_ca4 + fStack_444;
          auVar6 = vhaddps_avx(auVar45,auVar6);
          auVar44._4_4_ =
               fStack_d3c * fStack_4fc + fStack_cdc * fStack_5bc + fStack_49c * fStack_4bc;
          auVar44._0_4_ = local_d40 * local_500 + local_ce0 * local_5c0 + local_4a0 * local_4c0;
          auVar44._8_4_ =
               fStack_d38 * fStack_4f8 + fStack_cd8 * fStack_5b8 + fStack_498 * fStack_4b8;
          auVar44._12_4_ =
               fStack_d34 * fStack_4f4 + fStack_cd4 * fStack_5b4 + fStack_494 * fStack_4b4;
          auVar44._16_4_ =
               fStack_d30 * fStack_4f0 + fStack_cd0 * fStack_5b0 + fStack_490 * fStack_4b0;
          auVar44._20_4_ =
               fStack_d2c * fStack_4ec + fStack_ccc * fStack_5ac + fStack_48c * fStack_4ac;
          auVar44._24_4_ =
               fStack_d28 * fStack_4e8 + fStack_cc8 * fStack_5a8 + fStack_488 * fStack_4a8;
          auVar44._28_4_ = fStack_d24 + fStack_cc4 + fStack_484;
          auVar7._16_8_ = uStack_2d0;
          auVar7._0_16_ = auVar8;
          auVar7._24_8_ = uStack_2c8;
          auVar7 = vhaddps_avx(auVar44,auVar7);
          auVar6 = vhaddps_avx(auVar6,auVar7);
          local_300 = auVar6._16_4_;
          fStack_2fc = auVar6._20_4_;
          fStack_2f8 = auVar6._24_4_;
          fStack_2f4 = auVar6._28_4_;
          local_310 = auVar6._0_4_;
          fStack_30c = auVar6._4_4_;
          fStack_308 = auVar6._8_4_;
          fStack_304 = auVar6._12_4_;
          uVar42 = CONCAT44(fStack_2fc + fStack_30c,local_300 + local_310);
          uVar43 = CONCAT44(fStack_2f4 + fStack_304,fStack_2f8 + fStack_308);
          auVar9._8_8_ = uVar43;
          auVar9._0_8_ = uVar42;
          auVar8._8_8_ = uVar43;
          auVar8._0_8_ = uVar42;
          auVar8 = vunpckhpd_avx(auVar8,auVar9);
          local_240 = auVar8._0_4_;
          fStack_23c = auVar8._4_4_;
          *local_bc8 = local_300 + local_310 + local_240 + fStack_2fc + fStack_30c + fStack_23c +
                       *local_bc8;
          local_bc8 = local_bc8 + 1;
          local_d50 = local_d50 + 4;
          local_d58 = local_d58 + 4;
          local_d60 = local_d60 + 4;
        }
      }
      local_b70 = local_b70 + 0x24;
    }
  }
  return;
}

Assistant:

static void conv3x3s1_pack8to1_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    int remain_outch_start = 0;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;
        out0.fill(bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            __m256 _k00 = _mm256_loadu_ps(k0);
            __m256 _k01 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22 = _mm256_loadu_ps(k0 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                const float* r0 = img0.row(i);
                const float* r1 = img0.row(i + 1);
                const float* r2 = img0.row(i + 2);
                int j = 0;
                for (; j < outw; j++)
                {
                    __m256 _r00 = _mm256_loadu_ps(r0);
                    __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                    __m256 _r02 = _mm256_loadu_ps(r0 + 16);

                    __m256 _sum0 = _mm256_mul_ps(_k00, _r00);
                    __m256 _sum1 = _mm256_mul_ps(_k01, _r01);
                    __m256 _sum2 = _mm256_mul_ps(_k02, _r02);

                    __m256 _r10 = _mm256_loadu_ps(r1);
                    __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                    __m256 _r12 = _mm256_loadu_ps(r1 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k12, _r12, _sum2);

                    __m256 _r20 = _mm256_loadu_ps(r2);
                    __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                    __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k21, _r21, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k22, _r22, _sum2);
                    __m128 _sum = HorizontalSums(_sum0, _sum1, _sum2);

                    *outptr0 += _mm_reduce_add_ps(_sum); // dot
                    outptr0++;
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                }
            }

            k0 += 9 * 8;
        }
    }
}